

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.h
# Opt level: O2

bool match_int_fast_n(int *val,StreamCursor *cursor,size_t size)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t count;
  int iVar6;
  
  bVar3 = StreamCursor::eof(cursor);
  iVar6 = 0;
  if (!bVar3) {
    lVar2 = *(long *)&cursor->buf->field_0x10;
    sVar4 = StreamCursor::remaining(cursor);
    sVar5 = 0;
    while (bVar1 = *(byte *)(lVar2 + sVar5), count = sVar5, (byte)(bVar1 - 0x30) < 10) {
      iVar6 = iVar6 * 10 + (uint)bVar1 + -0x30;
      count = sVar5 + 1;
      bVar3 = size - 1 == sVar5;
      if ((sVar4 - 1 == sVar5) || (sVar5 = count, size != 0 && bVar3)) break;
    }
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      *val = iVar6;
      StreamCursor::advance(cursor,count);
      iVar6 = 1;
    }
  }
  return SUB41(iVar6,0);
}

Assistant:

inline bool match_int_fast_n(int *val, StreamCursor& cursor, size_t size)
{
    if (cursor.eof())
        return false;

    size_t i = 0;
    const char* p = cursor.offset();
    size_t remaining = cursor.remaining();

    int integer = 0;

    for (;;)
    {
        const char c = *p++;
        if (!(c >= '0' && c <= '9'))
            break;

        integer *= 10;
        integer += (c - '0');

        ++i;
        if (--remaining == 0 || (size > 0 && i == size))
            break;
    }

    if (i > 0) {
        *val = integer;
        cursor.advance(i);
        return true;
    }

    return false;

}